

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
          (QMetaMethodBuilderPrivate *this,MethodType _methodType,QByteArray *_signature,
          QByteArray *_returnType,Access _access,int _revision)

{
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  char *unaff_retaddr;
  char *in_stack_ffffffffffffffc8;
  
  QByteArray::constData((QByteArray *)0x37a55d);
  QMetaObject::normalizedSignature(unaff_retaddr);
  QByteArray::operator_cast_to_char_((QByteArray *)0x37a582);
  QMetaObject::normalizedType(in_stack_ffffffffffffffc8);
  QList<QByteArray>::QList((QList<QByteArray> *)0x37a5a7);
  QByteArray::QByteArray((QByteArray *)0x37a5b4);
  *(uint *)(in_RDI + 0x60) = in_R8D | in_ESI << 2;
  *(undefined4 *)(in_RDI + 100) = in_R9D;
  return;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }